

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numGuess.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long *plVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  char playAgain;
  int magicNumber;
  int guess;
  char local_45;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_45 = 'n';
  do {
    local_44 = 0;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Welcome to the number guessing game!",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 1: Please enter an integer between ",0x2a);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (inclusive).",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Floats will always be rounded down.",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    while (local_44 - 0x65U < 0xffffff9c) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number please: ",0xf);
      std::istream::operator>>((istream *)&std::cin,&local_44);
      if (local_44 - 0x65U < 0xffffff9c) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Number is out of bounds. Please try again",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 2: Please guess the number that player 1 chose.",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    iVar3 = 1;
    iVar11 = 100;
    iVar10 = -1;
    local_38 = 0;
    uVar8 = 0;
    do {
      local_40 = 0;
      local_3c = iVar10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You have ",9);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3 - uVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," guesses remaining.",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please choose a number between ",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
      if (local_40 < iVar3 || iVar11 < local_40) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"): ",3);
          std::istream::operator>>((istream *)&std::cin,&local_40);
          if (local_40 < iVar3 || iVar11 < local_40) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Number is out of bounds. Please try again",0x29);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
          }
        } while (iVar11 < local_40 || local_40 < iVar3);
      }
      iVar2 = local_3c;
      if (local_40 < local_44) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Your guess was too low!",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        iVar3 = local_40 + 1;
LAB_0010169c:
        bVar12 = true;
        iVar10 = local_40;
        if (iVar2 != -1) {
          uVar9 = local_44 - iVar2;
          uVar1 = -uVar9;
          if (0 < (int)uVar9) {
            uVar1 = uVar9;
          }
          uVar7 = local_44 - local_40;
          uVar9 = -uVar7;
          if (0 < (int)uVar7) {
            uVar9 = uVar7;
          }
          iVar10 = iVar2;
          if (uVar9 < uVar1) {
            iVar10 = local_40;
          }
        }
      }
      else {
        if (local_44 < local_40) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Your guess was too high!",0x18);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          iVar11 = local_40 + -1;
          goto LAB_0010169c;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Congrats! You won!",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        uVar5 = std::ostream::flush();
        local_38 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        bVar12 = false;
        iVar10 = iVar2;
      }
    } while ((bVar12) && (bVar12 = uVar8 < 2, uVar8 = uVar8 + 1, bVar12));
    if ((local_38 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Player 2 lost. Player 1 had number ",0x23);
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_44);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Player 2\'s closest guess was ",0x1d);
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter \'y\' to play again: ",0x19);
    std::operator>>((istream *)&std::cin,&local_45);
    iVar3 = tolower((int)local_45);
    if (iVar3 != 0x79) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    const int NUM_GUESSES = 3;
    const int MIN_NUMBER = 1;
    const int MAX_NUMBER = 100;

    char playAgain = 'n';

    do
    {
        int magicNumber = MIN_NUMBER - 1;

        cout << endl << "Welcome to the number guessing game!" << endl;
        cout << endl;
        cout << "Player 1: Please enter an integer between " << MIN_NUMBER <<
                " and " << MAX_NUMBER << " (inclusive)." << endl;
        cout << "Floats will always be rounded down." << endl;

        while(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
        {

            cout << "Number please: ";
            cin >> magicNumber;

            if(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
            {
                cout << "Number is out of bounds. Please try again" << endl;
            }
        }

        // Guessing section
        int lowerBound = MIN_NUMBER;
        int upperBound = MAX_NUMBER;
        bool numGuessed = false;
        int closestGuess = -1;

        cout << "Player 2: Please guess the number that player 1 chose." << endl;

        for (int i = 0; i < NUM_GUESSES; i++)
        {

            int guess = MIN_NUMBER - 1;
            int remainingGuesses = NUM_GUESSES - i;


            cout << "You have " << remainingGuesses << " guesses remaining." << endl;
            cout << "Please choose a number between " << lowerBound << " and " << upperBound << ".\n";

            while(outOfBounds(guess, lowerBound, upperBound))
            {
                cout << "(" << lowerBound << " - " << upperBound << "): ";
                cin >> guess;

                if(outOfBounds(guess, lowerBound, upperBound))
                {
                    cout << "Number is out of bounds. Please try again" << endl;
                }
            }

            if(guess < magicNumber)
            {
                cout << "Your guess was too low!" << endl;
                lowerBound = guess + 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else if(guess > magicNumber)
            {
                cout << "Your guess was too high!" << endl;
                upperBound = guess - 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else
            {
                cout << "Congrats! You won!" << endl;
                numGuessed = true;
                break;
            }
        }

        if(!numGuessed)
        {
            cout << "Player 2 lost. Player 1 had number " << magicNumber << endl;
            cout << "Player 2's closest guess was " << closestGuess << endl;
        }

        cout << "Enter 'y' to play again: ";
        cin >> playAgain;

    } while (tolower(playAgain) == 'y');

    return 0;
}